

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupportPlugin.cpp
# Opt level: O0

void __thiscall
MockSupportPlugin::postTestAction(MockSupportPlugin *this,UtestShell *test,TestResult *result)

{
  uint uVar1;
  MockSupport *pMVar2;
  SimpleString local_a0;
  SimpleString local_90;
  SimpleString local_80;
  SimpleString local_70 [2];
  SimpleString local_50;
  undefined1 local_40 [8];
  MockSupportPluginReporter reporter;
  TestResult *result_local;
  UtestShell *test_local;
  MockSupportPlugin *this_local;
  
  reporter.result_ = result;
  MockSupportPluginReporter::MockSupportPluginReporter
            ((MockSupportPluginReporter *)local_40,test,result);
  SimpleString::SimpleString(&local_50,"");
  pMVar2 = mock(&local_50,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x29])(pMVar2,local_40);
  SimpleString::~SimpleString(&local_50);
  uVar1 = (*test->_vptr_UtestShell[7])();
  if ((uVar1 & 1) == 0) {
    SimpleString::SimpleString(local_70,"");
    pMVar2 = mock(local_70,(MockFailureReporter *)0x0);
    (*pMVar2->_vptr_MockSupport[0x25])();
    SimpleString::~SimpleString(local_70);
  }
  SimpleString::SimpleString(&local_80,"");
  pMVar2 = mock(&local_80,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x27])();
  SimpleString::~SimpleString(&local_80);
  SimpleString::SimpleString(&local_90,"");
  pMVar2 = mock(&local_90,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x29])(pMVar2,0);
  SimpleString::~SimpleString(&local_90);
  SimpleString::SimpleString(&local_a0,"");
  pMVar2 = mock(&local_a0,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x2f])();
  SimpleString::~SimpleString(&local_a0);
  MockSupportPluginReporter::~MockSupportPluginReporter((MockSupportPluginReporter *)local_40);
  return;
}

Assistant:

void MockSupportPlugin::postTestAction(UtestShell& test, TestResult& result)
{
    MockSupportPluginReporter reporter(test, result);
    mock().setMockFailureStandardReporter(&reporter);
    if (!test.hasFailed())
        mock().checkExpectations();
    mock().clear();
    mock().setMockFailureStandardReporter(NULLPTR);
    mock().removeAllComparatorsAndCopiers();
}